

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vw_exception.cc
# Opt level: O0

void __thiscall
VW::vw_exception::vw_exception(vw_exception *this,char *pfile,int plineNumber,string *pmessage)

{
  string *in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  exception *in_RDI;
  
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__vw_exception_0048e960;
  *(undefined8 *)(in_RDI + 8) = in_RSI;
  std::__cxx11::string::string((string *)(in_RDI + 0x10),in_RCX);
  *(undefined4 *)(in_RDI + 0x30) = in_EDX;
  return;
}

Assistant:

vw_exception::vw_exception(const char* pfile, int plineNumber, std::string pmessage)
    : file(pfile), message(pmessage), lineNumber(plineNumber)
{
}